

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O3

void __thiscall pg::Game::parse_solution(Game *this,istream *in)

{
  ulong *puVar1;
  uint64_t *puVar2;
  char *__nptr;
  char cVar3;
  int iVar4;
  istream *piVar5;
  int *piVar6;
  ulong uVar7;
  long *plVar8;
  runtime_error *prVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  int w;
  int str;
  string token;
  string line;
  stringstream ss;
  undefined8 local_210;
  int local_204;
  char *local_200;
  undefined8 local_1f8;
  char local_1f0;
  undefined7 uStack_1ef;
  undefined1 *local_1e0;
  undefined8 local_1d8;
  undefined1 local_1d0;
  undefined7 uStack_1cf;
  istream *local_1c0;
  undefined1 local_1b8 [392];
  
  local_1e0 = &local_1d0;
  local_1d8 = 0;
  local_1d0 = 0;
  local_1c0 = in;
  while( true ) {
    cVar3 = std::ios::widen((char)in->_vptr_basic_istream[-3] + (char)in);
    piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (in,(string *)&local_1e0,cVar3);
    if (((&piVar5->field_0x20)[(long)piVar5->_vptr_basic_istream[-3]] & 5) != 0) {
      if (local_1e0 != &local_1d0) {
        operator_delete(local_1e0,CONCAT71(uStack_1cf,local_1d0) + 1);
      }
      return;
    }
    std::__cxx11::stringstream::stringstream
              ((stringstream *)local_1b8,(string *)&local_1e0,_S_out|_S_in);
    local_1f8 = 0;
    local_1f0 = '\0';
    local_200 = &local_1f0;
    piVar5 = std::operator>>((istream *)local_1b8,(string *)&local_200);
    if ((((&piVar5->field_0x20)[(long)piVar5->_vptr_basic_istream[-3]] & 5) == 0) &&
       (iVar4 = std::__cxx11::string::compare((char *)&local_200), __nptr = local_200, iVar4 != 0))
    break;
LAB_0013c7bd:
    if (local_200 != &local_1f0) {
      operator_delete(local_200,CONCAT71(uStack_1ef,local_1f0) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  piVar6 = __errno_location();
  iVar4 = *piVar6;
  *piVar6 = 0;
  uVar7 = strtol(__nptr,(char **)&local_210,10);
  if ((char *)CONCAT44(local_210._4_4_,(uint)local_210) == __nptr) {
    std::__throw_invalid_argument("stoi");
  }
  else if (((long)(int)uVar7 == uVar7) && (*piVar6 != 0x22)) {
    if (*piVar6 == 0) {
      *piVar6 = iVar4;
    }
    if ((-1 < (int)uVar7) && ((long)uVar7 < this->n_vertices)) {
      uVar12 = uVar7 >> 6;
      if (((this->solved)._bits[uVar12] >> (uVar7 & 0x3f) & 1) != 0) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"node already solved");
        goto LAB_0013c8c0;
      }
      plVar8 = (long *)std::istream::operator>>((istream *)local_1b8,(int *)&local_210);
      in = local_1c0;
      if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"missing winner");
LAB_0013c858:
        __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      if (1 < (uint)local_210) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar9,"invalid winner");
        goto LAB_0013c858;
      }
      uVar10 = 1L << (uVar7 & 0x3f);
      puVar1 = (this->solved)._bits + uVar12;
      *puVar1 = *puVar1 | uVar10;
      puVar2 = (this->winner)._bits;
      if ((uint)local_210 == 0) {
        uVar11 = ~uVar10 & puVar2[uVar12];
      }
      else {
        uVar11 = puVar2[uVar12] | uVar10;
      }
      puVar2[uVar12] = uVar11;
      if ((uint)local_210 == (((this->_owner)._bits[uVar12] & uVar10) != 0)) {
        plVar8 = (long *)std::istream::operator>>((istream *)local_1b8,&local_204);
        if ((*(byte *)((long)plVar8 + *(long *)(*plVar8 + -0x18) + 0x20) & 5) != 0) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar9,"missing strategy for winning node");
          __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        this->strategy[uVar7] = local_204;
      }
      else {
        this->strategy[uVar7] = -1;
      }
      goto LAB_0013c7bd;
    }
    goto LAB_0013c886;
  }
  std::__throw_out_of_range("stoi");
LAB_0013c886:
  prVar9 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar9,"node index out of bounds");
LAB_0013c8c0:
  __cxa_throw(prVar9,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
Game::parse_solution(std::istream &in)
{
    string line;
    while (getline(in, line)) {
        stringstream ss(line);
        string token;

        // ignore empty line
        if (!(ss >> token)) continue;

        // ignore line with "paritysol"
        if (token == "paritysol") continue;

        // get node
        int ident = stoi(token);
        if (ident < 0 || ident >= n_vertices) {
            throw std::runtime_error("node index out of bounds");
        }

        if (solved[ident]) throw std::runtime_error("node already solved");

        // parse winner
        int w;
        if (!(ss >> w)) throw std::runtime_error("missing winner");
        if (w!= 0 && w!= 1) throw std::runtime_error("invalid winner");

        // set winner
        solved[ident] = true;
        winner[ident] = w;

        // parse strategy
        if (w == _owner[ident]) {
            int str;
            if (!(ss >> str)) throw std::runtime_error("missing strategy for winning node");
            // if (!has_edge(ident, str)) throw std::runtime_error("strategy not successor of node");
            // actually this is already checked by the verifier
            strategy[ident] = str;
        } else {
            strategy[ident] = -1;
        }
    }
}